

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qconcatenatetablesproxymodel.cpp
# Opt level: O2

bool __thiscall
QConcatenateTablesProxyModel::canDropMimeData
          (QConcatenateTablesProxyModel *this,QMimeData *data,DropAction action,int row,int column,
          QModelIndex *parent)

{
  bool bVar1;
  undefined1 uVar2;
  long in_FS_OFFSET;
  QAbstractItemModel *sourceModel;
  QModelIndex local_40;
  int sourceColumn;
  int sourceRow;
  long local_20;
  int iVar3;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if (((*(QConcatenateTablesProxyModelPrivate **)(this + 8))->m_models).d.size != 0) {
    sourceRow = -0x55555556;
    sourceColumn = -0x55555556;
    local_40.r = -1;
    local_40.c = -1;
    local_40.i = 0;
    local_40.m.ptr = (QAbstractItemModel *)0x0;
    sourceModel = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
    bVar1 = QConcatenateTablesProxyModelPrivate::mapDropCoordinatesToSource
                      (*(QConcatenateTablesProxyModelPrivate **)(this + 8),row,column,parent,
                       &sourceRow,&sourceColumn,&local_40,&sourceModel);
    if (bVar1) {
      iVar3 = (*(sourceModel->super_QObject)._vptr_QObject[0x1b])
                        (sourceModel,data,(ulong)action,(ulong)(uint)sourceRow,
                         (ulong)(uint)sourceColumn,&local_40);
      uVar2 = (undefined1)iVar3;
      goto LAB_00411532;
    }
  }
  uVar2 = 0;
LAB_00411532:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return (bool)uVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool QConcatenateTablesProxyModel::canDropMimeData(const QMimeData *data, Qt::DropAction action, int row, int column, const QModelIndex &parent) const
{
    Q_D(const QConcatenateTablesProxyModel);
    if (d->m_models.isEmpty())
        return false;

    int sourceRow, sourceColumn;
    QModelIndex sourceParent;
    QAbstractItemModel *sourceModel;
    if (!d->mapDropCoordinatesToSource(row, column, parent, &sourceRow, &sourceColumn, &sourceParent, &sourceModel))
        return false;
    return sourceModel->canDropMimeData(data, action, sourceRow, sourceColumn, sourceParent);
}